

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall GlobOpt::EndTrackCall(GlobOpt *this,Instr *instr)

{
  uint *puVar1;
  OpCode OVar2;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  BasicBlock *pBVar10;
  Type *ppOVar11;
  StackSym *pSVar12;
  RegOpnd *pRVar13;
  Instr *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a0,"(instr)","instr");
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
  }
  bVar5 = OpCodeAttr::CallInstr(instr->m_opcode);
  if ((!bVar5) &&
     ((uVar6 = instr->m_opcode - 0x248, 0x21 < uVar6 ||
      ((0x200000023U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a2,
                       "(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)"
                       ,
                       "OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee"
                      );
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
  }
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a4,"(!this->isCallHelper)","!this->isCallHelper");
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
  }
  pBVar10 = this->currentBlock;
  pSVar3 = (pBVar10->globOptData).callSequence;
  if ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar3->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a5,"(!this->currentBlock->globOptData.callSequence->Empty())",
                       "!this->currentBlock->globOptData.callSequence->Empty()");
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
    pBVar10 = this->currentBlock;
  }
  uVar8 = (pBVar10->globOptData).argOutCount;
  while( true ) {
    ppOVar11 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                         ((pBVar10->globOptData).callSequence);
    pSVar12 = IR::Opnd::GetStackSym(*ppOVar11);
    pBVar10 = this->currentBlock;
    if ((pSVar12->field_0x1a & 0x30) == 0) break;
    puVar1 = &(pBVar10->globOptData).argOutCount;
    *puVar1 = *puVar1 - 1;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
              ((pBVar10->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
    pBVar10 = this->currentBlock;
  }
  ppOVar11 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                       ((pBVar10->globOptData).callSequence);
  pRVar13 = IR::Opnd::AsRegOpnd(*ppOVar11);
  pSVar12 = Sym::AsStackSym(&pRVar13->m_sym->super_Sym);
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
  if ((pSVar12->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b4,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
  }
  this_00 = (pSVar12->field_5).m_instrDef;
  if (this_00->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b5,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                       "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_0045e909;
    *puVar9 = 0;
    this_00 = (pSVar12->field_5).m_instrDef;
  }
  uVar6 = 1;
  uVar7 = IR::Instr::GetArgOutCount(this_00,true);
  OVar2 = instr->m_opcode;
  if (((OVar2 != NewScObject) && (OVar2 != NewScObjArray)) && (OVar2 != NewScObjectSpread)) {
    uVar6 = (uint)(OVar2 == NewScObjArraySpread);
  }
  if (uVar7 != (uVar8 - (this->currentBlock->globOptData).argOutCount) + uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3bc,
                       "((uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread))"
                       ,
                       "(uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread)"
                      );
    if (!bVar5) {
LAB_0045e909:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  uVar8 = IR::Instr::GetArgOutCount((pSVar12->field_5).m_instrDef,true);
  pBVar10 = this->currentBlock;
  puVar1 = &(pBVar10->globOptData).totalOutParamCount;
  *puVar1 = *puVar1 - uVar8;
  puVar1 = &(pBVar10->globOptData).startCallCount;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

void GlobOpt::EndTrackCall(IR::Instr* instr)
{
    Assert(instr);
    Assert(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd
        || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee);

    Assert(!this->isCallHelper);
    Assert(!this->currentBlock->globOptData.callSequence->Empty());


#if DBG
    uint origArgOutCount = this->currentBlock->globOptData.argOutCount;
#endif
    while (this->currentBlock->globOptData.callSequence->Head()->GetStackSym()->HasArgSlotNum())
    {
        this->currentBlock->globOptData.argOutCount--;
        this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);
    }
    StackSym * sym = this->currentBlock->globOptData.callSequence->Head()->AsRegOpnd()->m_sym->AsStackSym();
    this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);

#if DBG
    Assert(sym->m_isSingleDef);
    Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

    // Number of argument set should be the same as indicated at StartCall
    // except NewScObject has an implicit arg1
    Assert((uint)sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true) ==
        origArgOutCount - this->currentBlock->globOptData.argOutCount +
           (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray
           || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread));

#endif

    this->currentBlock->globOptData.totalOutParamCount -= sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
    this->currentBlock->globOptData.startCallCount--;
}